

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t *
Abc_ManResubQuit3(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,Abc_Obj_t *pObj2,
                 Abc_Obj_t *pObj3,int fOrGate)

{
  uint uVar1;
  int iVar2;
  Dec_Edge_t DVar3;
  Dec_Edge_t DVar4;
  uint uVar5;
  Dec_Graph_t *pGraph_00;
  Abc_Obj_t *pAVar6;
  Dec_Node_t *pDVar7;
  Dec_Edge_t eNode3;
  Dec_Edge_t eNode2;
  Dec_Edge_t eNode1;
  Dec_Edge_t eNode0;
  Dec_Edge_t ePrev1;
  Dec_Edge_t ePrev0;
  Dec_Edge_t eRoot;
  Dec_Graph_t *pGraph;
  int fOrGate_local;
  Abc_Obj_t *pObj3_local;
  Abc_Obj_t *pObj2_local;
  Abc_Obj_t *pObj1_local;
  Abc_Obj_t *pObj0_local;
  Abc_Obj_t *pRoot_local;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x306,
                  "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
                 );
  }
  if (pObj2 != pObj3) {
    pGraph_00 = Dec_GraphCreate(4);
    pAVar6 = Abc_ObjRegular(pObj0);
    pDVar7 = Dec_GraphNode(pGraph_00,0);
    (pDVar7->field_2).pFunc = pAVar6;
    pAVar6 = Abc_ObjRegular(pObj1);
    pDVar7 = Dec_GraphNode(pGraph_00,1);
    (pDVar7->field_2).pFunc = pAVar6;
    pAVar6 = Abc_ObjRegular(pObj2);
    pDVar7 = Dec_GraphNode(pGraph_00,2);
    (pDVar7->field_2).pFunc = pAVar6;
    pAVar6 = Abc_ObjRegular(pObj3);
    pDVar7 = Dec_GraphNode(pGraph_00,3);
    (pDVar7->field_2).pFunc = pAVar6;
    iVar2 = Abc_ObjIsComplement(pObj0);
    if ((iVar2 == 0) || (iVar2 = Abc_ObjIsComplement(pObj1), iVar2 == 0)) {
      pAVar6 = Abc_ObjRegular(pObj0);
      uVar1 = *(uint *)&pAVar6->field_0x14;
      uVar5 = Abc_ObjIsComplement(pObj0);
      DVar3 = Dec_EdgeCreate(0,uVar1 >> 7 & 1 ^ uVar5);
      pAVar6 = Abc_ObjRegular(pObj1);
      uVar1 = *(uint *)&pAVar6->field_0x14;
      uVar5 = Abc_ObjIsComplement(pObj1);
      DVar4 = Dec_EdgeCreate(1,uVar1 >> 7 & 1 ^ uVar5);
      eNode0 = Dec_GraphAddNodeAnd(pGraph_00,DVar3,DVar4);
      iVar2 = Abc_ObjIsComplement(pObj2);
      if ((iVar2 == 0) || (iVar2 = Abc_ObjIsComplement(pObj3), iVar2 == 0)) {
        pAVar6 = Abc_ObjRegular(pObj2);
        uVar1 = *(uint *)&pAVar6->field_0x14;
        uVar5 = Abc_ObjIsComplement(pObj2);
        DVar3 = Dec_EdgeCreate(2,uVar1 >> 7 & 1 ^ uVar5);
        pAVar6 = Abc_ObjRegular(pObj3);
        uVar1 = *(uint *)&pAVar6->field_0x14;
        uVar5 = Abc_ObjIsComplement(pObj3);
        DVar4 = Dec_EdgeCreate(3,uVar1 >> 7 & 1 ^ uVar5);
        eNode1 = Dec_GraphAddNodeAnd(pGraph_00,DVar3,DVar4);
      }
      else {
        pAVar6 = Abc_ObjRegular(pObj2);
        DVar3 = Dec_EdgeCreate(2,*(uint *)&pAVar6->field_0x14 >> 7 & 1);
        pAVar6 = Abc_ObjRegular(pObj3);
        DVar4 = Dec_EdgeCreate(3,*(uint *)&pAVar6->field_0x14 >> 7 & 1);
        eNode1 = Dec_GraphAddNodeOr(pGraph_00,DVar3,DVar4);
      }
    }
    else {
      pAVar6 = Abc_ObjRegular(pObj0);
      DVar3 = Dec_EdgeCreate(0,*(uint *)&pAVar6->field_0x14 >> 7 & 1);
      pAVar6 = Abc_ObjRegular(pObj1);
      DVar4 = Dec_EdgeCreate(1,*(uint *)&pAVar6->field_0x14 >> 7 & 1);
      eNode0 = Dec_GraphAddNodeOr(pGraph_00,DVar3,DVar4);
      iVar2 = Abc_ObjIsComplement(pObj2);
      if ((iVar2 == 0) || (iVar2 = Abc_ObjIsComplement(pObj3), iVar2 == 0)) {
        pAVar6 = Abc_ObjRegular(pObj2);
        uVar1 = *(uint *)&pAVar6->field_0x14;
        uVar5 = Abc_ObjIsComplement(pObj2);
        DVar3 = Dec_EdgeCreate(2,uVar1 >> 7 & 1 ^ uVar5);
        pAVar6 = Abc_ObjRegular(pObj3);
        uVar1 = *(uint *)&pAVar6->field_0x14;
        uVar5 = Abc_ObjIsComplement(pObj3);
        DVar4 = Dec_EdgeCreate(3,uVar1 >> 7 & 1 ^ uVar5);
        eNode1 = Dec_GraphAddNodeAnd(pGraph_00,DVar3,DVar4);
      }
      else {
        pAVar6 = Abc_ObjRegular(pObj2);
        DVar3 = Dec_EdgeCreate(2,*(uint *)&pAVar6->field_0x14 >> 7 & 1);
        pAVar6 = Abc_ObjRegular(pObj3);
        DVar4 = Dec_EdgeCreate(3,*(uint *)&pAVar6->field_0x14 >> 7 & 1);
        eNode1 = Dec_GraphAddNodeOr(pGraph_00,DVar3,DVar4);
      }
    }
    if (fOrGate == 0) {
      ePrev1 = Dec_GraphAddNodeAnd(pGraph_00,eNode0,eNode1);
    }
    else {
      ePrev1 = Dec_GraphAddNodeOr(pGraph_00,eNode0,eNode1);
    }
    Dec_GraphSetRoot(pGraph_00,ePrev1);
    if ((*(uint *)&pRoot->field_0x14 >> 7 & 1) != 0) {
      Dec_GraphComplement(pGraph_00);
    }
    return pGraph_00;
  }
  __assert_fail("pObj2 != pObj3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                ,0x307,
                "Dec_Graph_t *Abc_ManResubQuit3(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)"
               );
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit3( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, Abc_Obj_t * pObj2, Abc_Obj_t * pObj3, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, ePrev0, ePrev1, eNode0, eNode1, eNode2, eNode3;
    assert( pObj0 != pObj1 );
    assert( pObj2 != pObj3 );
    pGraph = Dec_GraphCreate( 4 );
    Dec_GraphNode( pGraph, 0 )->pFunc = Abc_ObjRegular(pObj0);
    Dec_GraphNode( pGraph, 1 )->pFunc = Abc_ObjRegular(pObj1);
    Dec_GraphNode( pGraph, 2 )->pFunc = Abc_ObjRegular(pObj2);
    Dec_GraphNode( pGraph, 3 )->pFunc = Abc_ObjRegular(pObj3);
    if ( Abc_ObjIsComplement(pObj0) && Abc_ObjIsComplement(pObj1) )
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase );
        ePrev0 = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    else
    {
        eNode0 = Dec_EdgeCreate( 0, Abc_ObjRegular(pObj0)->fPhase ^ Abc_ObjIsComplement(pObj0) );
        eNode1 = Dec_EdgeCreate( 1, Abc_ObjRegular(pObj1)->fPhase ^ Abc_ObjIsComplement(pObj1) );
        ePrev0 = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
        if ( Abc_ObjIsComplement(pObj2) && Abc_ObjIsComplement(pObj3) )
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase );
            ePrev1 = Dec_GraphAddNodeOr( pGraph, eNode2, eNode3 );
        }
        else
        {
            eNode2 = Dec_EdgeCreate( 2, Abc_ObjRegular(pObj2)->fPhase ^ Abc_ObjIsComplement(pObj2) );
            eNode3 = Dec_EdgeCreate( 3, Abc_ObjRegular(pObj3)->fPhase ^ Abc_ObjIsComplement(pObj3) );
            ePrev1 = Dec_GraphAddNodeAnd( pGraph, eNode2, eNode3 );
        }
    }
    if ( fOrGate ) 
        eRoot = Dec_GraphAddNodeOr( pGraph, ePrev0, ePrev1 );
    else
        eRoot = Dec_GraphAddNodeAnd( pGraph, ePrev0, ePrev1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}